

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlFileWrite(void *context,char *buffer,int len)

{
  int iVar1;
  size_t sVar2;
  int items;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  if ((context == (void *)0x0) || (buffer == (char *)0x0)) {
    context_local._4_4_ = -1;
  }
  else {
    sVar2 = fwrite(buffer,(long)len,1,(FILE *)context);
    if (((int)sVar2 == 0) && (iVar1 = ferror((FILE *)context), iVar1 != 0)) {
      xmlIOErr(0,"fwrite()");
      return -1;
    }
    context_local._4_4_ = (int)sVar2 * len;
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlFileWrite (void * context, const char * buffer, int len) {
    int items;

    if ((context == NULL) || (buffer == NULL))
        return(-1);
    items = fwrite(&buffer[0], len, 1, (FILE *) context);
    if ((items == 0) && (ferror((FILE *) context))) {
        xmlIOErr(0, "fwrite()");
	return(-1);
    }
    return(items * len);
}